

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_ignored_stdio(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_timer_t *loop;
  int extraout_EDX;
  uv_process_t *puVar3;
  uv_timer_t *puVar4;
  code *pcVar5;
  char *handle;
  
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016af70;
    if (exit_cb_called != 1) goto LAB_0016af75;
    if (close_cb_called != 1) goto LAB_0016af7a;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0016af70:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0016af75:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0016af7a:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  loop = (uv_timer_t *)uv_default_loop();
  puVar3 = &process;
  iVar1 = uv_spawn((uv_loop_t *)loop,&process,&options);
  if (iVar1 == 0) {
    loop = (uv_timer_t *)uv_default_loop();
    puVar4 = &timer;
    iVar1 = uv_timer_init((uv_loop_t *)loop,&timer);
    pcVar5 = (code *)puVar4;
    if (iVar1 != 0) goto LAB_0016b057;
    loop = &timer;
    pcVar5 = timer_cb;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar1 != 0) goto LAB_0016b05c;
    loop = (uv_timer_t *)uv_default_loop();
    pcVar5 = (code *)0x0;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016b061;
    if (exit_cb_called != 1) goto LAB_0016b066;
    if (close_cb_called != 2) goto LAB_0016b06b;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcVar5 = (code *)0x0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar5 = (code *)puVar3;
LAB_0016b057:
    run_test_spawn_and_kill_cold_2();
LAB_0016b05c:
    run_test_spawn_and_kill_cold_3();
LAB_0016b061:
    run_test_spawn_and_kill_cold_4();
LAB_0016b066:
    run_test_spawn_and_kill_cold_5();
LAB_0016b06b:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  handle = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar5 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close((uv_handle_t *)loop,close_cb);
      handle = (char *)(ulong)*(uint *)&((uv_loop_t *)loop)->watchers;
      iVar1 = uv_kill(*(uint *)&((uv_loop_t *)loop)->watchers,0);
      if (iVar1 == -3) {
        return -3;
      }
      goto LAB_0016b0ca;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0016b0ca:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close((uv_handle_t *)handle,close_cb);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_ignored_stdio) {
  int r;

  init_process_options("spawn_helper6", exit_cb);

  options.stdio = NULL;
  options.stdio_count = 0;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}